

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

void __thiscall Map<String,_int>::~Map(Map<String,_int> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Item *this_00;
  
  for (this_00 = (this->_begin).item; this_00 != &this->endItem; this_00 = this_00->next) {
    String::~String(&this_00->key);
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  String::~String(&(this->endItem).key);
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }